

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O2

bool __thiscall
prometheus::Family<prometheus::Summary>::Has(Family<prometheus::Summary> *this,Labels *labels)

{
  size_type sVar1;
  
  std::mutex::lock(&this->mutex_);
  sVar1 = std::_Hashtable<$670374b0$>::count(&(this->metrics_)._M_h,labels);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return sVar1 != 0;
}

Assistant:

bool Family<T>::Has(const Labels& labels) const {
  std::lock_guard<std::mutex> lock{mutex_};
  return metrics_.count(labels) != 0u;
}